

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sys.cpp
# Opt level: O1

optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
Vault::Sys::rewrap(optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *__return_storage_ptr__,Sys *this,Token *token)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Client *client;
  undefined1 local_12b;
  undefined1 local_12a;
  undefined1 local_129;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_128;
  size_type local_120;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_118;
  Path local_108;
  Url local_e8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  local_c8;
  _Hashtable<_ea4cb122_> local_68;
  
  client = this->client_;
  local_128 = &local_118;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"wrapping/rewrap","");
  paVar1 = &local_108.value_.field_2;
  if (local_128 == &local_118) {
    local_108.value_.field_2._8_8_ = local_118._8_8_;
    local_108.value_._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_108.value_._M_dataplus._M_p = (pointer)local_128;
  }
  local_108.value_.field_2._M_allocated_capacity._1_7_ = local_118._M_allocated_capacity._1_7_;
  local_108.value_.field_2._M_local_buf[0] = local_118._M_local_buf[0];
  local_108.value_._M_string_length = local_120;
  local_120 = 0;
  local_118._M_local_buf[0] = '\0';
  local_128 = &local_118;
  getUrl(&local_e8,this,&local_108);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  ::
  pair<const_char_(&)[6],_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
            (&local_c8,(char (*) [6])0x1a3264,&token->value_);
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::variant<std::__cxx11::string,int,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::unordered_map<std::__cxx11::string,std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>>>,std::allocator<std::pair<std::__cxx11::string_const,std::variant<std::__cxx11::string,int,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::unordered_map<std::__cxx11::string,std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::
  _Hashtable<std::pair<std::__cxx11::string_const,std::variant<std::__cxx11::string,int,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::unordered_map<std::__cxx11::string,std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>>>const*>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::variant<std::__cxx11::string,int,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::unordered_map<std::__cxx11::string,std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>>>,std::allocator<std::pair<std::__cxx11::string_const,std::variant<std::__cxx11::string,int,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::unordered_map<std::__cxx11::string,std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)&local_68,&local_c8,&local_68,0,&local_129,&local_12a,&local_12b);
  HttpConsumer::post(__return_storage_ptr__,client,&local_e8,(Parameters *)&local_68);
  std::_Hashtable<$ea4cb122$>::~_Hashtable(&local_68);
  std::__detail::__variant::
  _Variant_storage<false,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::~_Variant_storage((_Variant_storage<false,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                       *)&local_c8.second);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8.first._M_dataplus._M_p != &local_c8.first.field_2) {
    operator_delete(local_c8.first._M_dataplus._M_p,local_c8.first.field_2._M_allocated_capacity + 1
                   );
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8.value_._M_dataplus._M_p != &local_e8.value_.field_2) {
    operator_delete(local_e8.value_._M_dataplus._M_p,
                    local_e8.value_.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108.value_._M_dataplus._M_p != paVar1) {
    operator_delete(local_108.value_._M_dataplus._M_p,
                    local_108.value_.field_2._M_allocated_capacity + 1);
  }
  if (local_128 != &local_118) {
    operator_delete(local_128,
                    CONCAT71(local_118._M_allocated_capacity._1_7_,local_118._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::optional<std::string> Vault::Sys::rewrap(const Token &token) {
  return HttpConsumer::post(client_, getUrl(Path{"wrapping/rewrap"}),
                            Parameters({{"token", token.value()}}));
}